

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O1

void __thiscall
CDBBatch::Write<std::pair<unsigned_char,int>,CBlockFileInfo>
          (CDBBatch *this,pair<unsigned_char,_int> *key,CBlockFileInfo *value)

{
  DataStream *ssValue;
  long lVar1;
  pointer pbVar2;
  long in_FS_OFFSET;
  Span<const_std::byte> key_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
            (&(this->ssKey).vch,(this->ssKey).m_read_pos + 0x40);
  ssValue = &this->ssValue;
  std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::reserve
            (&ssValue->vch,(this->ssValue).m_read_pos + 0x400);
  Serialize<DataStream,unsigned_char,int>(&this->ssKey,key);
  CBlockFileInfo::SerializationOps<DataStream,CBlockFileInfo_const,ActionSerialize>(value,ssValue);
  key_00.m_data =
       (this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
       _M_impl.super__Vector_impl_data._M_start + (this->ssKey).m_read_pos;
  key_00.m_size =
       (long)(this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)key_00.m_data;
  WriteImpl(this,key_00,ssValue);
  pbVar2 = (this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
      .super__Vector_impl_data._M_finish != pbVar2) {
    (this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar2;
  }
  (this->ssKey).m_read_pos = 0;
  pbVar2 = (this->ssValue).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->ssValue).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
      _M_impl.super__Vector_impl_data._M_finish != pbVar2) {
    (this->ssValue).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
    .super__Vector_impl_data._M_finish = pbVar2;
  }
  (this->ssValue).m_read_pos = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Write(const K& key, const V& value)
    {
        ssKey.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssValue.reserve(DBWRAPPER_PREALLOC_VALUE_SIZE);
        ssKey << key;
        ssValue << value;
        WriteImpl(ssKey, ssValue);
        ssKey.clear();
        ssValue.clear();
    }